

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O2

void __thiscall
discordpp::field<discordpp::InstallParams>::field
          (field<discordpp::InstallParams> *this,field<discordpp::InstallParams> *f)

{
  if ((f->t_)._M_t.
      super___uniq_ptr_impl<discordpp::InstallParams,_std::default_delete<discordpp::InstallParams>_>
      ._M_t.
      super__Tuple_impl<0UL,_discordpp::InstallParams_*,_std::default_delete<discordpp::InstallParams>_>
      .super__Head_base<0UL,_discordpp::InstallParams_*,_false>._M_head_impl == (InstallParams *)0x0
     ) {
    (this->t_)._M_t.
    super___uniq_ptr_impl<discordpp::InstallParams,_std::default_delete<discordpp::InstallParams>_>.
    _M_t.
    super__Tuple_impl<0UL,_discordpp::InstallParams_*,_std::default_delete<discordpp::InstallParams>_>
    .super__Head_base<0UL,_discordpp::InstallParams_*,_false>._M_head_impl = (InstallParams *)0x0;
  }
  else {
    std::make_unique<discordpp::InstallParams,discordpp::InstallParams&>((InstallParams *)this);
  }
  this->s_ = f->s_;
  return;
}

Assistant:

field(const field<T> &f)
        : t_(f.t_ ? std::make_unique<T>(*f.t_) : nullptr), s_(f.s_) {}